

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_short,_4U>::getUINTPacked
          (ImageT<unsigned_short,_4U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  int iVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  color<unsigned_short,_4U> *this_00;
  uchar *puVar7;
  int in_ECX;
  int in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  allocator_type *in_RDI;
  int in_R8D;
  int in_R9D;
  uint32_t pack;
  uchar *target;
  Color *pixel;
  uint32_t x;
  uint32_t y;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  uint3 in_stack_ffffffffffffff8c;
  uint targetBits;
  allocator_type *__n;
  uint local_3c;
  uint local_38;
  
  if (in_EDX + in_ECX + in_R8D + in_R9D != 0x20) {
    __assert_fail("c0 + c1 + c2 + c3 == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x419,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 4>::getUINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 4]"
                 );
  }
  targetBits = (uint)in_stack_ffffffffffffff8c;
  if (((in_EDX != 0) && (targetBits = (uint)in_stack_ffffffffffffff8c, in_ECX != 0)) &&
     (targetBits = (uint)in_stack_ffffffffffffff8c, in_R8D != 0)) {
    targetBits = CONCAT13(in_R9D != 0,in_stack_ffffffffffffff8c);
  }
  if ((char)(targetBits >> 0x18) != '\0') {
    __n = in_RDI;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x14595b);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(in_RSI,(size_type)__n,in_RDI)
    ;
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x14597a);
    for (local_38 = 0;
        local_38 <
        *(uint *)((long)&(in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_finish + 4); local_38 = local_38 + 1) {
      for (local_3c = 0;
          local_3c <
          *(uint *)&(in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish; local_3c = local_3c + 1) {
        this_00 = (color<unsigned_short,_4U> *)
                  (in_RSI[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                  (ulong)(local_38 *
                          *(int *)&(in_RSI->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + local_3c) * 8);
        puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1459db);
        iVar1 = *(int *)&(in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_finish;
        color<unsigned_short,_4U>::operator[](this_00,0);
        uVar3 = imageio::convertUINT((uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,targetBits);
        bVar2 = (byte)in_R9D;
        color<unsigned_short,_4U>::operator[](this_00,1);
        uVar4 = imageio::convertUINT((uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,targetBits);
        color<unsigned_short,_4U>::operator[](this_00,2);
        uVar5 = imageio::convertUINT((uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,targetBits);
        color<unsigned_short,_4U>::operator[](this_00,3);
        uVar6 = imageio::convertUINT((uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,targetBits);
        *(uint32_t *)(puVar7 + (ulong)(local_38 * iVar1 + local_3c) * 4) =
             uVar6 | uVar5 << (bVar2 & 0x1f) |
                     uVar4 << ((char)in_R8D + bVar2 & 0x1f) |
                     uVar3 << ((char)in_ECX + (char)in_R8D + bVar2 & 0x1f);
      }
    }
    return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__n;
  }
  __assert_fail("c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x41a,
                "virtual std::vector<uint8_t> ImageT<unsigned short, 4>::getUINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 4]"
               );
}

Assistant:

virtual std::vector<uint8_t> getUINTPacked(uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert(c0 + c1 + c2 + c3 == 32);
        assert(c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0);
        assert(componentCount == 4);

        std::vector<uint8_t> data(height * width * sizeof(uint32_t));
        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * sizeof(uint32_t);

                uint32_t pack = 0;
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[0]), sizeof(uint32_t) * 8, c0) << (c1 + c2 + c3);
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[1]), sizeof(uint32_t) * 8, c1) << (c2 + c3);
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[2]), sizeof(uint32_t) * 8, c2) << c3;
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[3]), sizeof(uint32_t) * 8, c3);

                std::memcpy(target, &pack, sizeof(pack));
            }
        }

        return data;
    }